

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2polyline.cc
# Opt level: O0

S2Point * __thiscall
S2Polyline::Project(S2Point *__return_storage_ptr__,S2Polyline *this,S2Point *point,int *next_vertex
                   )

{
  int *x;
  bool bVar1;
  int iVar2;
  int iVar3;
  S2Point *pSVar4;
  S2Point *pSVar5;
  ostream *poVar6;
  S2LogMessage local_90;
  S2LogMessageVoidify local_79;
  double local_78;
  double local_70;
  double local_68;
  S1Angle distance_to_segment;
  int i;
  int min_index;
  S1Angle min_distance;
  S2LogMessage local_38;
  S2LogMessageVoidify local_21;
  int *local_20;
  int *next_vertex_local;
  S2Point *point_local;
  S2Polyline *this_local;
  
  local_20 = next_vertex;
  next_vertex_local = (int *)point;
  point_local = (S2Point *)this;
  iVar2 = num_vertices(this);
  if (iVar2 < 1) {
    S2FatalLogMessage::S2FatalLogMessage
              ((S2FatalLogMessage *)&local_38,
               "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2polyline.cc"
               ,0xdf,kFatal,(ostream *)&std::cerr);
    poVar6 = S2LogMessage::stream(&local_38);
    poVar6 = std::operator<<(poVar6,"Check failed: (num_vertices()) > (0) ");
    S2LogMessageVoidify::operator&(&local_21,poVar6);
    S2FatalLogMessage::~S2FatalLogMessage((S2FatalLogMessage *)&local_38);
  }
  iVar2 = num_vertices(this);
  if (iVar2 == 1) {
    *local_20 = 1;
    pSVar4 = vertex(this,0);
    __return_storage_ptr__->c_[0] = pSVar4->c_[0];
    __return_storage_ptr__->c_[1] = pSVar4->c_[1];
    __return_storage_ptr__->c_[2] = pSVar4->c_[2];
  }
  else {
    _i = S1Angle::Radians(10.0);
    distance_to_segment.radians_._4_4_ = -1;
    for (distance_to_segment.radians_._0_4_ = 1; iVar2 = distance_to_segment.radians_._0_4_,
        iVar3 = num_vertices(this), x = next_vertex_local, iVar2 < iVar3;
        distance_to_segment.radians_._0_4_ = distance_to_segment.radians_._0_4_ + 1) {
      pSVar4 = vertex(this,distance_to_segment.radians_._0_4_ + -1);
      pSVar5 = vertex(this,distance_to_segment.radians_._0_4_);
      local_70 = (double)S2::GetDistance((S2Point *)x,pSVar4,pSVar5);
      local_78 = _i;
      local_68 = local_70;
      bVar1 = ::operator<((S1Angle)local_70,_i);
      if (bVar1) {
        _i = local_68;
        distance_to_segment.radians_._4_4_ = distance_to_segment.radians_._0_4_;
      }
    }
    if (distance_to_segment.radians_._4_4_ == -1) {
      S2FatalLogMessage::S2FatalLogMessage
                ((S2FatalLogMessage *)&local_90,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2polyline.cc"
                 ,0xf4,kFatal,(ostream *)&std::cerr);
      poVar6 = S2LogMessage::stream(&local_90);
      poVar6 = std::operator<<(poVar6,"Check failed: (min_index) != (-1) ");
      S2LogMessageVoidify::operator&(&local_79,poVar6);
      S2FatalLogMessage::~S2FatalLogMessage((S2FatalLogMessage *)&local_90);
    }
    pSVar4 = vertex(this,distance_to_segment.radians_._4_4_ + -1);
    pSVar5 = vertex(this,distance_to_segment.radians_._4_4_);
    S2::Project(__return_storage_ptr__,(S2Point *)x,pSVar4,pSVar5);
    iVar2 = distance_to_segment.radians_._4_4_;
    pSVar4 = vertex(this,distance_to_segment.radians_._4_4_);
    bVar1 = util::math::internal_vector::BasicVector<Vector3,_double,_3UL>::operator==
                      ((BasicVector<Vector3,_double,_3UL> *)__return_storage_ptr__,pSVar4);
    *local_20 = iVar2 + (uint)bVar1;
  }
  return __return_storage_ptr__;
}

Assistant:

S2Point S2Polyline::Project(const S2Point& point, int* next_vertex) const {
  S2_DCHECK_GT(num_vertices(), 0);

  if (num_vertices() == 1) {
    // If there is only one vertex, it is always closest to any given point.
    *next_vertex = 1;
    return vertex(0);
  }

  // Initial value larger than any possible distance on the unit sphere.
  S1Angle min_distance = S1Angle::Radians(10);
  int min_index = -1;

  // Find the line segment in the polyline that is closest to the point given.
  for (int i = 1; i < num_vertices(); ++i) {
    S1Angle distance_to_segment = S2::GetDistance(point, vertex(i-1),
                                                          vertex(i));
    if (distance_to_segment < min_distance) {
      min_distance = distance_to_segment;
      min_index = i;
    }
  }
  S2_DCHECK_NE(min_index, -1);

  // Compute the point on the segment found that is closest to the point given.
  S2Point closest_point =
      S2::Project(point, vertex(min_index - 1), vertex(min_index));

  *next_vertex = min_index + (closest_point == vertex(min_index) ? 1 : 0);
  return closest_point;
}